

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes.c
# Opt level: O0

sunrealtype cvSensNorm(CVodeMem cv_mem,N_Vector *xS,N_Vector *wS)

{
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  sunrealtype nrm;
  int is;
  undefined8 local_28;
  undefined4 local_1c;
  
  N_VWrmsNormVectorArray
            (*(undefined4 *)(in_RDI + 0x90),in_RSI,in_RDX,*(undefined8 *)(in_RDI + 0xa50));
  local_28 = **(double **)(in_RDI + 0xa50);
  for (local_1c = 1; local_1c < *(int *)(in_RDI + 0x90); local_1c = local_1c + 1) {
    if (local_28 < *(double *)(*(long *)(in_RDI + 0xa50) + (long)local_1c * 8)) {
      local_28 = *(double *)(*(long *)(in_RDI + 0xa50) + (long)local_1c * 8);
    }
  }
  return local_28;
}

Assistant:

sunrealtype cvSensNorm(CVodeMem cv_mem, N_Vector* xS, N_Vector* wS)
{
  int is;
  sunrealtype nrm;

  (void)N_VWrmsNormVectorArray(cv_mem->cv_Ns, xS, wS, cv_mem->cv_cvals);

  nrm = cv_mem->cv_cvals[0];
  for (is = 1; is < cv_mem->cv_Ns; is++)
  {
    if (cv_mem->cv_cvals[is] > nrm) { nrm = cv_mem->cv_cvals[is]; }
  }

  return (nrm);
}